

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256_leaf.cpp
# Opt level: O3

array_ptr<unsigned_char,_true> __thiscall
duckdb::Node256Leaf::GetBytes(Node256Leaf *this,ArenaAllocator *arena)

{
  data_ptr_t ptr_p;
  uchar *puVar1;
  ushort uVar2;
  uint16_t i;
  ulong uVar3;
  array_ptr<unsigned_char,_true> bytes;
  array_ptr<unsigned_char,_true> local_30;
  
  ptr_p = ArenaAllocator::AllocateAligned(arena,(ulong)this->count);
  array_ptr<unsigned_char,_true>::array_ptr(&local_30,ptr_p,(ulong)this->count);
  uVar3 = 0;
  uVar2 = 0;
  do {
    if ((this->mask[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
      puVar1 = array_ptr<unsigned_char,_true>::operator[](&local_30,(ulong)uVar2);
      uVar2 = uVar2 + 1;
      *puVar1 = (uchar)uVar3;
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x100);
  return local_30;
}

Assistant:

array_ptr<uint8_t> Node256Leaf::GetBytes(ArenaAllocator &arena) {
	auto mem = arena.AllocateAligned(sizeof(uint8_t) * count);
	array_ptr<uint8_t> bytes(mem, count);

	ValidityMask v_mask(&mask[0], Node256::CAPACITY);
	uint16_t ptr_idx = 0;
	for (uint16_t i = 0; i < CAPACITY; i++) {
		if (v_mask.RowIsValid(i)) {
			bytes[ptr_idx++] = UnsafeNumericCast<uint8_t>(i);
		}
	}

	return bytes;
}